

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConnectorFederateManager.cpp
# Opt level: O3

Translator * __thiscall
helics::ConnectorFederateManager::getTranslator(ConnectorFederateManager *this,string_view name)

{
  int iVar1;
  Translator **ppTVar2;
  Translator *pTVar3;
  BlockIterator<helics::Translator,_32,_helics::Translator_**> tran;
  handle trans;
  BlockIterator<helics::Translator,_32,_helics::Translator_**> local_48;
  handle local_30;
  
  gmlc::libguarded::
  shared_guarded_opt<gmlc::containers::StringMappedVector<helics::Translator,_(reference_stability)0,_5>,_std::shared_mutex>
  ::lock(&local_30,&this->translators);
  gmlc::containers::StringMappedVector<helics::Translator,_(reference_stability)0,_5>::find
            (&local_48,local_30.data,name);
  iVar1 = ((local_30.data)->dataStorage).bsize;
  ppTVar2 = ((local_30.data)->dataStorage).dataptr;
  if (iVar1 == 0x20) {
    if (ppTVar2 == (Translator **)0x0) {
      ppTVar2 = (Translator **)
                &gmlc::containers::
                 StableBlockVector<helics::Translator,5u,std::allocator<helics::Translator>>::end()
                 ::emptyValue;
    }
    else {
      ppTVar2 = ppTVar2 + (long)((local_30.data)->dataStorage).dataSlotIndex + 1;
    }
    iVar1 = 0;
  }
  else {
    ppTVar2 = ppTVar2 + ((local_30.data)->dataStorage).dataSlotIndex;
  }
  pTVar3 = local_48.ptr;
  if (((ppTVar2 == local_48.vec) ||
      (((local_48.vec != (Translator **)0x0 && (*local_48.vec == (Translator *)0x0)) &&
       (*ppTVar2 == (Translator *)0x0)))) && (iVar1 == local_48.offset)) {
    pTVar3 = (Translator *)invalidTranNC;
  }
  std::unique_lock<std::shared_mutex>::~unique_lock(&local_30.m_handle_lock);
  return pTVar3;
}

Assistant:

Translator& ConnectorFederateManager::getTranslator(std::string_view name)
{
    auto trans = translators.lock();
    auto tran = trans->find(name);
    return (tran != trans.end()) ? (*tran) : invalidTranNC;
}